

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icu_util.h
# Opt level: O2

void booster::locale::impl_icu::throw_icu_error(UErrorCode err)

{
  runtime_error *this;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  this = (runtime_error *)__cxa_allocate_exception(0x30);
  pcVar1 = (char *)u_errorName_70(err);
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  runtime_error::runtime_error(this,&local_38);
  __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

inline void throw_icu_error(UErrorCode err)
    {
        throw booster::runtime_error(u_errorName(err));
    }